

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfMapNamedBufferRange(ErrorsTest *this)

{
  ostringstream *this_00;
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  void *pvVar8;
  undefined4 *puVar9;
  byte bVar10;
  GLuint not_a_buffer_name;
  GLuint GVar11;
  long lVar12;
  GLuint i_1;
  GLuint buffer;
  GLuint buffer_special_flags;
  byte local_1b9;
  byte local_1b8;
  byte local_1b7;
  byte local_1b6;
  byte local_1b5;
  GLubyte dummy_data [4];
  undefined1 local_1b0 [384];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  buffer = 0;
  buffer_special_flags = 0;
  dummy_data[0] = '\0';
  dummy_data[1] = '\0';
  dummy_data[2] = '\0';
  dummy_data[3] = '\0';
  (**(code **)(lVar7 + 0x3b8))(1);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1026);
  (*this->m_pNamedBufferStorage)(buffer,4,dummy_data,0x43);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x102a);
  GVar11 = 0;
  do {
    GVar11 = GVar11 + 1;
    cVar1 = (**(code **)(lVar7 + 0xc68))(GVar11);
  } while (cVar1 != '\0');
  (*this->m_pMapNamedBufferRange)(GVar11,0,4,1);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                           " if buffer is not the name of an existing buffer object.");
  pvVar8 = (*this->m_pMapNamedBufferRange)(buffer,-1,4,1);
  bVar3 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501," if offset is negative.");
  if (pvVar8 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(buffer);
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
  }
  pvVar8 = (*this->m_pMapNamedBufferRange)(buffer,0,-1,1);
  bVar4 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501," if length is negative.");
  if (pvVar8 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(buffer);
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
  }
  pvVar8 = (*this->m_pMapNamedBufferRange)(buffer,0,8,1);
  local_1b5 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501,
                               " if length is greater than the value of BUFFER_SIZE for the buffer object, or if access has any bits set other than those defined above."
                              );
  if (pvVar8 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(buffer);
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
  }
  pvVar8 = (*this->m_pMapNamedBufferRange)(buffer,2,4,1);
  local_1b6 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501,
                               " if offset+length is greater than the value of BUFFER_SIZE for the buffer object, or if access has any bits set other than those defined above."
                              );
  if (pvVar8 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(buffer);
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
  }
  pvVar8 = (*this->m_pMapNamedBufferRange)(buffer,0,0,1);
  local_1b7 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502," if length is zero.");
  if (pvVar8 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)(buffer);
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
  }
  (*this->m_pMapNamedBufferRange)(buffer,0,4,1);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glMapNamedBuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1090);
  local_1b8 = bVar4;
  pvVar8 = (*this->m_pMapNamedBufferRange)(buffer,0,4,1);
  local_1b9 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                               " if the buffer object is in a mapped state.");
  (*this->m_pUnmapNamedBuffer)(buffer);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1099);
  if (pvVar8 == (void *)0x0) {
    pvVar8 = (*this->m_pMapNamedBufferRange)(buffer,0,4,0);
    bVar4 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                             " if neither MAP_READ_BIT nor MAP_WRITE_BIT is set.");
    if (pvVar8 != (void *)0x0) {
      (*this->m_pUnmapNamedBuffer)(buffer);
      do {
        iVar5 = (**(code **)(lVar7 + 0x800))();
      } while (iVar5 != 0);
    }
    bVar10 = (bVar2 && bVar3) & local_1b8 & local_1b5 & local_1b6 & local_1b7 & local_1b9 & bVar4;
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      pvVar8 = (*this->m_pMapNamedBufferRange)(buffer,0,4,(&DAT_01710e40)[lVar12] | 1);
      bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                               (GLchar *)((long)&DAT_01710e4c + (long)(int)(&DAT_01710e4c)[lVar12]))
      ;
      if (pvVar8 != (void *)0x0) {
        (*this->m_pUnmapNamedBuffer)(buffer);
        do {
          iVar5 = (**(code **)(lVar7 + 0x800))();
        } while (iVar5 != 0);
      }
      bVar10 = bVar10 & bVar2;
    }
    pvVar8 = (*this->m_pMapNamedBufferRange)(buffer,0,4,0x11);
    bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                             " if MAP_FLUSH_EXPLICIT_BIT is set and MAP_WRITE_BIT is not set.");
    if (pvVar8 != (void *)0x0) {
      (*this->m_pUnmapNamedBuffer)(buffer);
      do {
        iVar5 = (**(code **)(lVar7 + 0x800))();
      } while (iVar5 != 0);
    }
    bVar2 = (bool)(bVar10 & bVar2);
    for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
      (**(code **)(lVar7 + 0x3b8))(1,&buffer_special_flags);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glCreateBuffers failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x10f9);
      (*this->m_pNamedBufferStorage)(buffer_special_flags,4,dummy_data,(&DAT_0170ddb0)[lVar12]);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"glNamedBuffeStorage failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                      ,0x10fc);
      pvVar8 = (*this->m_pMapNamedBufferRange)(buffer_special_flags,0,4,(&DAT_0170ddc0)[lVar12]);
      bVar3 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                               (GLchar *)((long)&DAT_01710e58 + (long)(int)(&DAT_01710e58)[lVar12]))
      ;
      if (pvVar8 != (void *)0x0) {
        (*this->m_pUnmapNamedBuffer)(buffer);
        do {
          iVar5 = (**(code **)(lVar7 + 0x800))();
        } while (iVar5 != 0);
      }
      if (buffer_special_flags != 0) {
        (**(code **)(lVar7 + 0x438))(1,&buffer_special_flags);
        buffer_special_flags = 0;
      }
      bVar2 = (bool)(bVar2 & bVar3);
    }
    if (buffer != 0) {
      (**(code **)(lVar7 + 0x438))(1,&buffer);
      buffer = 0;
    }
    if (buffer_special_flags != 0) {
      (**(code **)(lVar7 + 0x438))(1,&buffer_special_flags);
    }
    return bVar2;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "glMapNamedBufferRange called on mapped buffer returned non-NULL pointer when error shall occure.This may lead to undefined behavior during next tests (object still may be mapped). Test was terminated prematurely."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 0;
  __cxa_throw(puVar9,&int::typeinfo,0);
}

Assistant:

bool ErrorsTest::TestErrorsOfMapNamedBufferRange()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer				  = 0;
	glw::GLuint  buffer_special_flags = 0;
	glw::GLubyte dummy_data[4]		  = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pMapNamedBufferRange(not_a_buffer_name, 0, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test negative offset error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, -1, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE, " if offset is negative.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test negative length error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, -1, GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE, " if length is negative.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test length overflow error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data) * 2, GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE,
									  " if length is greater than the value of BUFFER_SIZE"
									  " for the buffer object, or if access has any bits set other"
									  " than those defined above.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test (offset+length) overflow error behavior. */
		{
			glw::GLvoid* mapped_data =
				m_pMapNamedBufferRange(buffer, sizeof(dummy_data) / 2, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE,
									  " if offset+length is greater than the value of BUFFER_SIZE"
									  " for the buffer object, or if access has any bits set other"
									  " than those defined above.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test zero length error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, 0, GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION, " if length is zero.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test mapping of mapped buffer error behavior. */
		{
			m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer.");

			glw::GLvoid* subsequent_mapped_data =
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if the buffer object is in a mapped state.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			if (subsequent_mapped_data)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glMapNamedBufferRange called on mapped buffer returned non-NULL pointer when error shall "
					   "occure."
					   "This may lead to undefined behavior during next tests (object still may be mapped). "
					   "Test was terminated prematurely."
					<< tcu::TestLog::EndMessage;
				throw 0;
			}
		}

		/* Test access flag read and write bits are not set error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), 0);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if neither MAP_READ_BIT nor MAP_WRITE_BIT is set.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test read access invalid flags error behavior. */
		{
			glw::GLenum read_access_invalid_flags[] = { GL_MAP_INVALIDATE_RANGE_BIT, GL_MAP_INVALIDATE_BUFFER_BIT,
														GL_MAP_UNSYNCHRONIZED_BIT };
			const glw::GLchar* read_access_invalid_flags_log[] = {
				" if MAP_READ_BIT is set with MAP_INVALIDATE_RANGE_BIT.",
				" if MAP_READ_BIT is set with MAP_INVALIDATE_BUFFER_BIT.",
				" if MAP_READ_BIT is set with MAP_UNSYNCHRONIZED_BIT."
			};
			glw::GLuint read_access_invalid_flags_count =
				sizeof(read_access_invalid_flags) / sizeof(read_access_invalid_flags[0]);

			for (glw::GLuint i = 0; i < read_access_invalid_flags_count; ++i)
			{
				glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data),
																  GL_MAP_READ_BIT | read_access_invalid_flags[i]);

				is_ok &=
					ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION, read_access_invalid_flags_log[i]);

				/* Sanity unmapping. */
				if (DE_NULL != mapped_data)
				{
					m_pUnmapNamedBuffer(buffer);
					while (gl.getError())
						;
				}
			}
		}

		/* Test access flush bit without write bit error behavior. */
		{
			glw::GLvoid* mapped_data =
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if MAP_FLUSH_EXPLICIT_BIT is set and MAP_WRITE_BIT is not set.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test incompatible buffer flag error behavior. */
		{
			glw::GLenum buffer_flags[] = { GL_MAP_WRITE_BIT, GL_MAP_READ_BIT, GL_MAP_WRITE_BIT,
										   GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT };
			glw::GLenum mapping_flags[] = { GL_MAP_READ_BIT, GL_MAP_WRITE_BIT, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT,
											GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT };
			const glw::GLchar* mapping_flags_log[] = {
				" if MAP_READ_BIT is set, but the same bit is not included in the buffer's storage flags.",
				" if MAP_WRITE_BIT is set, but the same bit is not included in the buffer's storage flags.",
				" if MAP_PERSISTENT_BIT is set, but the same bit is not included in the buffer's storage flags.",
				" if MAP_COHERENT_BIT is set, but the same bit is not included in the buffer's storage flags."
			};
			glw::GLuint flags_count = sizeof(mapping_flags) / sizeof(mapping_flags[0]);

			for (glw::GLuint i = 0; i < flags_count; ++i)
			{
				/* Create buffer. */
				gl.createBuffers(1, &buffer_special_flags);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

				m_pNamedBufferStorage(buffer_special_flags, sizeof(dummy_data), &dummy_data, buffer_flags[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

				/* Test mapping. */
				glw::GLvoid* mapped_data =
					m_pMapNamedBufferRange(buffer_special_flags, 0, sizeof(dummy_data), mapping_flags[i]);

				is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION, mapping_flags_log[i]);

				/* Sanity unmapping. */
				if (DE_NULL != mapped_data)
				{
					m_pUnmapNamedBuffer(buffer);
					while (gl.getError())
						;
				}

				/* Releasing buffer. */
				if (buffer_special_flags)
				{
					gl.deleteBuffers(1, &buffer_special_flags);

					buffer_special_flags = 0;
				}
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (buffer_special_flags)
	{
		gl.deleteBuffers(1, &buffer_special_flags);

		buffer_special_flags = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}